

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * __thiscall gl4cts::GLSL420Pack::UTF8CharactersTest::casesToStr(UTF8CharactersTest *this)

{
  TestError *this_00;
  char *local_18;
  GLchar *result;
  UTF8CharactersTest *this_local;
  
  switch((this->m_test_case).m_case) {
  case IN_COMMENT:
    local_18 = "in comment";
    break;
  case IN_PREPROCESSOR:
    local_18 = "in preprocessor";
    break;
  case AS_LAST_CHARACTER_NULL_TERMINATED:
    local_18 = "just before null";
    break;
  case AS_LAST_CHARACTER_NON_NULL_TERMINATED:
    local_18 = "as last character";
    break;
  case DEBUG_CASE:
    local_18 = "nowhere. This is debug!";
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0xf91);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_18;
}

Assistant:

const GLchar* UTF8CharactersTest::casesToStr() const
{
	const GLchar* result = 0;

	switch (m_test_case.m_case)
	{
	case IN_COMMENT:
		result = "in comment";
		break;
	case IN_PREPROCESSOR:
		result = "in preprocessor";
		break;
	case AS_LAST_CHARACTER_NULL_TERMINATED:
		result = "just before null";
		break;
	case AS_LAST_CHARACTER_NON_NULL_TERMINATED:
		result = "as last character";
		break;
	case DEBUG_CASE:
		result = "nowhere. This is debug!";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}